

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncTimeCoordinator.cpp
# Opt level: O0

MessageProcessingResult __thiscall
helics::AsyncTimeCoordinator::checkExecEntry(AsyncTimeCoordinator *this,GlobalFederateId param_2)

{
  long in_RDI;
  ActionMessage execgrant;
  MessageProcessingResult ret;
  uint7 in_stack_ffffffffffffff00;
  MessageProcessingResult MVar1;
  undefined4 in_stack_ffffffffffffff18;
  action_t in_stack_ffffffffffffff1c;
  ActionMessage *in_stack_ffffffffffffff20;
  GlobalFederateId local_d4 [3];
  undefined4 local_c8;
  ActionMessage *in_stack_ffffffffffffff50;
  AsyncTimeCoordinator *in_stack_ffffffffffffff58;
  GlobalFederateId in_stack_ffffffffffffff64;
  
  *(undefined1 *)(in_RDI + 0x53) = 1;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined1 *)(in_RDI + 0x60) = 5;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  ActionMessage::ActionMessage(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  local_c8 = *(undefined4 *)(in_RDI + 0x48);
  local_d4[0].gid = 0;
  GlobalFederateId::GlobalFederateId(local_d4);
  transmitTimingMessagesDownstream
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff64);
  transmitTimingMessagesUpstream
            ((AsyncTimeCoordinator *)in_stack_ffffffffffffff20,
             (ActionMessage *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  MVar1 = NEXT_STEP;
  ActionMessage::~ActionMessage((ActionMessage *)(ulong)in_stack_ffffffffffffff00);
  return MVar1;
}

Assistant:

MessageProcessingResult AsyncTimeCoordinator::checkExecEntry(GlobalFederateId /*triggerFed*/)
{
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;

    executionMode = true;
    ret = MessageProcessingResult::NEXT_STEP;

    currentMinTime = timeZero;
    currentTimeState = TimeState::time_granted;
    nextEvent = timeZero;

    ActionMessage execgrant(CMD_EXEC_GRANT);
    execgrant.source_id = mSourceId;
    transmitTimingMessagesDownstream(execgrant);
    transmitTimingMessagesUpstream(execgrant);
    return ret;
}